

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

void Abc_AigSetNodePhases(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  void **ppvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Abc_Obj_t *pAVar6;
  void *pvVar7;
  long *plVar8;
  
  iVar4 = Abc_NtkIsDfsOrdered(pNtk);
  if (iVar4 == 0) {
    __assert_fail("Abc_NtkIsDfsOrdered(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                  ,0x571,"void Abc_AigSetNodePhases(Abc_Ntk_t *)");
  }
  pAVar6 = Abc_AigConst1(pNtk);
  pAVar6->field_0x14 = pAVar6->field_0x14 | 0x80;
  for (iVar4 = 0; iVar4 < pNtk->vPis->nSize; iVar4 = iVar4 + 1) {
    pvVar7 = Vec_PtrEntry(pNtk->vPis,iVar4);
    *(byte *)((long)pvVar7 + 0x14) = *(byte *)((long)pvVar7 + 0x14) & 0x7f;
  }
  iVar4 = 0;
  do {
    if (pNtk->vBoxes->nSize <= iVar4) {
      for (iVar4 = 0; iVar4 < pNtk->vObjs->nSize; iVar4 = iVar4 + 1) {
        pAVar6 = Abc_NtkObj(pNtk,iVar4);
        if (pAVar6 != (Abc_Obj_t *)0x0) {
          iVar5 = Abc_AigNodeIsAnd(pAVar6);
          if (iVar5 != 0) {
            ppvVar2 = pAVar6->pNtk->vObjs->pArray;
            piVar3 = (pAVar6->vFanins).pArray;
            uVar1 = *(uint *)&pAVar6->field_0x14;
            *(uint *)&pAVar6->field_0x14 =
                 uVar1 & 0xffffff7f |
                 ((uVar1 >> 0xb ^ *(uint *)((long)ppvVar2[piVar3[1]] + 0x14) >> 7) &
                  (uVar1 >> 10 ^ *(uint *)((long)ppvVar2[*piVar3] + 0x14) >> 7) & 1) << 7;
          }
        }
      }
      for (iVar4 = 0; iVar4 < pNtk->vPos->nSize; iVar4 = iVar4 + 1) {
        plVar8 = (long *)Vec_PtrEntry(pNtk->vPos,iVar4);
        *(uint *)((long)plVar8 + 0x14) =
             *(uint *)((long)plVar8 + 0x14) & 0xffffff7f |
             (*(uint *)((long)plVar8 + 0x14) >> 3 ^
             *(uint *)(*(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                (long)*(int *)plVar8[4] * 8) + 0x14)) & 0x80;
      }
      for (iVar4 = 0; iVar4 < pNtk->vBoxes->nSize; iVar4 = iVar4 + 1) {
        pAVar6 = Abc_NtkBox(pNtk,iVar4);
        if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
          pAVar6 = Abc_NtkBox(pNtk,iVar4);
          plVar8 = (long *)pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanins).pArray];
          *(uint *)((long)plVar8 + 0x14) =
               *(uint *)((long)plVar8 + 0x14) & 0xffffff7f |
               (*(uint *)((long)plVar8 + 0x14) >> 3 ^
               *(uint *)(*(long *)(*(long *)(*(long *)(*plVar8 + 0x20) + 8) +
                                  (long)*(int *)plVar8[4] * 8) + 0x14)) & 0x80;
        }
      }
      return;
    }
    pAVar6 = Abc_NtkBox(pNtk,iVar4);
    if ((*(uint *)&pAVar6->field_0x14 & 0xf) == 8) {
      pAVar6 = Abc_NtkBox(pNtk,iVar4);
      pvVar7 = pAVar6->pNtk->vObjs->pArray[*(pAVar6->vFanouts).pArray];
      if ((*(uint *)((long)pvVar7 + 0x14) & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x1a9,"int Abc_LatchIsInit1(Abc_Obj_t *)");
      }
      *(uint *)((long)pvVar7 + 0x14) =
           *(uint *)((long)pvVar7 + 0x14) & 0xffffff78 |
           (uint)(*(long *)((long)pvVar7 + 0x38) == 2) << 7;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Abc_AigSetNodePhases( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    assert( Abc_NtkIsDfsOrdered(pNtk) );
    Abc_AigConst1(pNtk)->fPhase = 1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        pObj->fPhase = 0;
    Abc_NtkForEachLatchOutput( pNtk, pObj, i )
        pObj->fPhase = Abc_LatchIsInit1(pObj);
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj)) & (Abc_ObjFanin1(pObj)->fPhase ^ Abc_ObjFaninC1(pObj));
    Abc_NtkForEachPo( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
    Abc_NtkForEachLatchInput( pNtk, pObj, i )
        pObj->fPhase = (Abc_ObjFanin0(pObj)->fPhase ^ Abc_ObjFaninC0(pObj));
}